

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O2

bool __thiscall llbuild::basic::FileSystem::createDirectories(FileSystem *this,string *path)

{
  int iVar1;
  Style in_ECX;
  undefined1 uVar2;
  StringRef path_00;
  StringRef parent;
  string local_40;
  
  iVar1 = (*this->_vptr_FileSystem[2])();
  uVar2 = 1;
  if ((char)iVar1 == '\0') {
    path_00.Length = 2;
    path_00.Data = (char *)path->_M_string_length;
    parent = llvm::sys::path::parent_path((path *)(path->_M_dataplus)._M_p,path_00,in_ECX);
    if (parent.Length == 0) {
      uVar2 = 0;
    }
    else {
      llvm::StringRef::str_abi_cxx11_(&local_40,&parent);
      iVar1 = (*this->_vptr_FileSystem[3])(this,&local_40);
      if ((char)iVar1 == '\0') {
        uVar2 = 0;
      }
      else {
        iVar1 = (*this->_vptr_FileSystem[2])(this,path);
        uVar2 = (undefined1)iVar1;
      }
      std::__cxx11::string::_M_dispose();
    }
  }
  return (bool)uVar2;
}

Assistant:

bool FileSystem::createDirectories(const std::string& path) {
  // Attempt to create the final directory first, to optimize for the common
  // case where we don't need to recurse.
  if (createDirectory(path))
    return true;

  // If that failed, attempt to create the parent.
  StringRef parent = llvm::sys::path::parent_path(path);
  if (parent.empty())
    return false;
  return createDirectories(parent) && createDirectory(path);
}